

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test::
~CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test
          (CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test
            ((CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test *)
             0x28aa58);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(39060180);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb), CfdException);

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}